

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double Alg::min_vector_nonzero_mask
                 (vector<double,_std::allocator<double>_> *budget_list,
                 vector<bool,_std::allocator<bool>_> *mask)

{
  double dVar1;
  pointer pdVar2;
  const_reference cVar3;
  size_t i;
  ulong __n;
  double dVar4;
  
  dVar4 = 4294967295.0;
  for (__n = 0; pdVar2 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start,
      __n < (ulong)((long)(budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                          .super__Vector_impl_data._M_finish - (long)pdVar2 >> 3); __n = __n + 1) {
    dVar1 = pdVar2[__n];
    if ((dVar1 < dVar4) && (0.0001 < ABS(dVar1))) {
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
      if (!cVar3) {
        dVar4 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[__n];
      }
    }
  }
  return dVar4;
}

Assistant:

double Alg::min_vector_nonzero_mask(const std::vector<double> & budget_list, const std::vector<bool> & mask) {
    double tmp = WINT_MAX;
    const double esp = 0.0001;
    for (size_t i = 0; i < budget_list.size(); i++) {
        if (budget_list[i] < tmp && fabs(budget_list[i]) > esp && mask[i] == false) {
            tmp = budget_list[i];
        }
    }
    return tmp;
}